

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_image_write(nifti_image *nim)

{
  znzFile __ptr;
  int iVar1;
  
  __ptr = nifti_image_write_hdr_img(nim,1,"wb");
  iVar1 = g_opts_0;
  if (__ptr != (znzFile)0x0) {
    if (2 < g_opts_0) {
      fwrite("-d niw: done with znzFile\n",0x1a,1,_stderr);
    }
    iVar1 = g_opts_0;
    free(__ptr);
  }
  if (iVar1 < 2) {
    return;
  }
  fwrite("-d nifti_image_write: done\n",0x1b,1,_stderr);
  return;
}

Assistant:

void nifti_image_write( nifti_image *nim )
{
   znzFile fp = nifti_image_write_hdr_img(nim,1,"wb");
   if( fp ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d niw: done with znzFile\n");
      free(fp);
   }
   if( g_opts.debug > 1 ) fprintf(stderr,"-d nifti_image_write: done\n");
}